

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::VarintTest_TestWriteNullConstant_Test::TestBody
          (VarintTest_TestWriteNullConstant_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_d8;
  Message local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  allocator local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  string local_60 [32];
  ByteBuffer local_40 [8];
  ByteBuffer buffer;
  VarintTest_TestWriteNullConstant_Test *this_local;
  
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(local_40,10);
  std::__cxx11::string::string(local_60,(string *)&Varint::kNullString_abi_cxx11_);
  bidfx_public_api::tools::Varint::WriteString(&buffer,local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"",1,&local_a1);
  bidfx_public_api::tools::ByteBuffer::ToString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_80,"std::string(\"\\000\", 1)","buffer.ToString()",&local_a0,
             &local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/varint_test.cpp"
               ,0xcb,message);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_40);
  return;
}

Assistant:

TEST(VarintTest, TestWriteNullConstant)
{
    ByteBuffer buffer = ByteBuffer(10);
    Varint::WriteString(buffer, Varint::kNullString);
    EXPECT_EQ(std::string("\000", 1), buffer.ToString());
}